

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap.cpp
# Opt level: O2

void Assimp::Bitmap::WriteDIB(DIB *dib,IOStream *file)

{
  undefined8 local_28;
  int32_t local_20;
  undefined4 local_1c;
  uint32_t local_18;
  uint32_t uStack_14;
  int32_t iStack_10;
  int32_t iStack_c;
  undefined8 local_8;
  
  local_28._0_4_ = dib->size;
  local_28._4_4_ = dib->width;
  local_20 = dib->height;
  local_1c._0_2_ = dib->planes;
  local_1c._2_2_ = dib->bits_per_pixel;
  local_18 = dib->compression;
  uStack_14 = dib->image_size;
  iStack_10 = dib->x_resolution;
  iStack_c = dib->y_resolution;
  local_8._0_4_ = dib->nb_colors;
  local_8._4_4_ = dib->nb_important_colors;
  (*file->_vptr_IOStream[3])(file,&local_28,0x28,1);
  return;
}

Assistant:

void Bitmap::WriteDIB(DIB& dib, IOStream* file) {
        uint8_t data[DIB::dib_size];

        std::size_t offset = 0;

        offset += Copy(&data[offset], dib.size);
        offset += Copy(&data[offset], dib.width);
        offset += Copy(&data[offset], dib.height);
        offset += Copy(&data[offset], dib.planes);
        offset += Copy(&data[offset], dib.bits_per_pixel);
        offset += Copy(&data[offset], dib.compression);
        offset += Copy(&data[offset], dib.image_size);
        offset += Copy(&data[offset], dib.x_resolution);
        offset += Copy(&data[offset], dib.y_resolution);
        offset += Copy(&data[offset], dib.nb_colors);
                  Copy(&data[offset], dib.nb_important_colors);

        file->Write(data, DIB::dib_size, 1);
    }